

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clufactor_rational.hpp
# Opt level: O2

void __thiscall soplex::CLUFactorRational::remaxCol(CLUFactorRational *this,int p_col,int len)

{
  Dring *pDVar1;
  Dring *pDVar2;
  Dring *pDVar3;
  int iVar4;
  long lVar5;
  int *piVar6;
  long lVar7;
  long lVar8;
  int iVar9;
  
  if ((Col *)(this->u).col.elem[p_col].next == &(this->u).col) {
    piVar6 = (this->u).col.max;
    iVar9 = len - piVar6[p_col];
    iVar4 = (this->u).col.used;
    if ((this->u).col.size - iVar4 < iVar9) {
      packColumns(this);
      piVar6 = (this->u).col.max;
      iVar4 = (this->u).col.used;
      iVar9 = len - piVar6[p_col];
      if ((double)(this->u).col.size < (double)len + (double)iVar4 * this->colMemMult) {
        minColMem(this,len + iVar4 * 2);
        iVar4 = (this->u).col.used;
        piVar6 = (this->u).col.max;
      }
    }
    (this->u).col.used = iVar4 + iVar9;
    piVar6[p_col] = len;
  }
  else {
    iVar4 = (this->u).col.used;
    if ((this->u).col.size - iVar4 < len) {
      packColumns(this);
      iVar4 = (this->u).col.used;
      if ((double)(this->u).col.size < (double)len + (double)iVar4 * this->colMemMult) {
        minColMem(this,len + iVar4 * 2);
        iVar4 = (this->u).col.used;
      }
    }
    piVar6 = (this->u).col.start;
    lVar7 = (long)piVar6[p_col];
    lVar8 = (this->u).col.len[p_col] + lVar7;
    piVar6[p_col] = iVar4;
    piVar6 = &(this->u).col.used;
    *piVar6 = *piVar6 + len;
    pDVar1 = (this->u).col.elem;
    piVar6 = (this->u).col.max;
    pDVar2 = pDVar1[p_col].prev;
    piVar6[pDVar2->idx] = piVar6[pDVar2->idx] + piVar6[p_col];
    piVar6[p_col] = len;
    pDVar3 = pDVar1[p_col].next;
    pDVar3->prev = pDVar2;
    pDVar2->next = pDVar3;
    pDVar2 = (this->u).col.list.prev;
    pDVar3 = pDVar2->next;
    pDVar1[p_col].next = pDVar3;
    pDVar3->prev = pDVar1 + p_col;
    pDVar1[p_col].prev = pDVar2;
    pDVar2->next = pDVar1 + p_col;
    piVar6 = (this->u).col.idx;
    lVar5 = (long)iVar4;
    for (; lVar7 < lVar8; lVar7 = lVar7 + 1) {
      piVar6[lVar5] = piVar6[lVar7];
      lVar5 = lVar5 + 1;
    }
  }
  return;
}

Assistant:

inline void CLUFactorRational::remaxCol(int p_col, int len)
{
   assert(u.col.max[p_col] < len);

   if(u.col.elem[p_col].next == &(u.col.list))      /* last in column file */
   {
      int delta = len - u.col.max[p_col];

      if(delta > u.col.size - u.col.used)
      {
         packColumns();
         delta = len - u.col.max[p_col];

         if(u.col.size < colMemMult * u.col.used + len)
            minColMem(2 * u.col.used + len);

         /* minColMem(colMemMult * u.col.used + len); */
      }

      assert(delta <= u.col.size - u.col.used

             && "ERROR: could not allocate memory for column file");

      u.col.used += delta;
      u.col.max[p_col] = len;
   }

   else                        /* column must be moved to end of column file */
   {
      int i, j, k;
      int* idx;
      Dring* ring;

      if(len > u.col.size - u.col.used)
      {
         packColumns();

         if(u.col.size < colMemMult * u.col.used + len)
            minColMem(2 * u.col.used + len);

         /* minColMem(colMemMult * u.col.used + len); */
      }

      assert(len <= u.col.size - u.col.used

             && "ERROR: could not allocate memory for column file");

      j = u.col.used;
      i = u.col.start[p_col];
      k = u.col.len[p_col] + i;
      u.col.start[p_col] = j;
      u.col.used += len;

      u.col.max[u.col.elem[p_col].prev->idx] += u.col.max[p_col];
      u.col.max[p_col] = len;
      removeDR(u.col.elem[p_col]);
      ring = u.col.list.prev;
      init2DR(u.col.elem[p_col], *ring);

      idx = u.col.idx;

      for(; i < k; ++i)
         idx[j++] = idx[i];
   }
}